

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-server.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  ushort uVar3;
  duration<long,_std::ratio<1L,_1000L>_> local_60;
  Communicator server1;
  Communicator server0;
  vector<char,_std::allocator<char>_> data;
  
  printf("Usage: %s port\n");
  if (argc < 2) {
    return -1;
  }
  iVar2 = atoi(argv[1]);
  GGSock::Communicator::Communicator(&server0,false);
  GGSock::Communicator::Communicator(&server1,false);
  std::vector<char,_std::allocator<char>_>::vector(&data,0x20000,(allocator_type *)&local_60);
  do {
    GGSock::Communicator::listen((int)&server0,iVar2,0);
    GGSock::Communicator::listen((int)&server1,iVar2,0);
    cVar1 = GGSock::Communicator::isConnected();
    if (cVar1 != '\0') {
      puts("sending client 1");
      uVar3 = (ushort)&server0;
      GGSock::Communicator::send(uVar3);
      GGSock::Communicator::send
                (uVar3,(char *)0x5e,
                 (uint)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    }
    cVar1 = GGSock::Communicator::isConnected();
    if (cVar1 != '\0') {
      puts("sending client 2");
      uVar3 = (ushort)&server1;
      GGSock::Communicator::send(uVar3);
      GGSock::Communicator::send
                (uVar3,(char *)0x5e,
                 (uint)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    }
    GGSock::Communicator::update();
    GGSock::Communicator::update();
    local_60.__r = 100;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_60);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s port\n", argv[0]);
    if (argc < 2) {
        return -1;
    }

    int port = atoi(argv[1]);

    GGSock::Communicator server0(false);
    GGSock::Communicator server1(false);

    std::vector<char> data(128*1024);

    while (true) {
        server0.listen(port, 0);
        server1.listen(port, 0);

        if (server0.isConnected()) {
            printf("sending client 1\n");
            server0.send(95);
            server0.send(94, data.data(), data.size());
        }

        if (server1.isConnected()) {
            printf("sending client 2\n");
            server1.send(95);
            server1.send(94, data.data(), data.size());
        }

        server0.update();
        server1.update();

		std::this_thread::sleep_for(std::chrono::milliseconds(100));
	}

    return 0;
}